

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTreeViewItem>::insert
          (QMovableArrayOps<QTreeViewItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QTreeViewItem **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  undefined8 uVar9;
  long lVar10;
  qsizetype inserts;
  QTreeViewItem *pQVar11;
  long in_FS_OFFSET;
  bool bVar12;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(undefined8 *)&t->field_0x20;
  uVar5 = (t->index).r;
  uVar6 = (t->index).c;
  qVar7 = (t->index).i;
  pQVar8 = (t->index).m.ptr;
  uVar9 = *(undefined8 *)&t->parentItem;
  bVar12 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.size
           != 0;
  QArrayDataPointer<QTreeViewItem>::detachAndGrow
            ((QArrayDataPointer<QTreeViewItem> *)this,(uint)(i == 0 && bVar12),n,
             (QTreeViewItem **)0x0,(QArrayDataPointer<QTreeViewItem> *)0x0);
  if (i == 0 && bVar12) {
    if (n != 0) {
      do {
        pQVar11 = (this->super_QGenericArrayOps<QTreeViewItem>).
                  super_QArrayDataPointer<QTreeViewItem>.ptr;
        *(undefined8 *)&pQVar11[-1].field_0x20 = uVar4;
        pQVar11[-1].index.m.ptr = pQVar8;
        *(undefined8 *)&pQVar11[-1].parentItem = uVar9;
        pQVar11[-1].index.r = uVar5;
        pQVar11[-1].index.c = uVar6;
        pQVar11[-1].index.i = qVar7;
        ppQVar1 = &(this->super_QGenericArrayOps<QTreeViewItem>).
                   super_QArrayDataPointer<QTreeViewItem>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QTreeViewItem>).
                  super_QArrayDataPointer<QTreeViewItem>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    pQVar11 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
              ptr + i;
    memmove(pQVar11 + n,pQVar11,
            ((this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
             size - i) * 0x28);
    lVar10 = n;
    if (n != 0) {
      do {
        *(undefined8 *)&pQVar11->field_0x20 = uVar4;
        (pQVar11->index).m.ptr = pQVar8;
        *(undefined8 *)&pQVar11->parentItem = uVar9;
        (pQVar11->index).r = uVar5;
        (pQVar11->index).c = uVar6;
        (pQVar11->index).i = qVar7;
        pQVar11 = pQVar11 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
              size;
    *pqVar2 = *pqVar2 + n;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }